

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O0

bool __thiscall
MeCab::Writer::writeNode(Writer *this,Lattice *lattice,char *p,Node *node,StringBuffer *os)

{
  char cVar1;
  ushort uVar2;
  bool bVar3;
  StringBuffer *this_00;
  int iVar4;
  undefined8 uVar5;
  void *__buf;
  char **ppcVar6;
  char **max;
  uint uVar7;
  long in_RCX;
  char *pcVar8;
  uint *__n;
  char *in_RDX;
  long *in_RSI;
  StringBuffer *in_R8;
  bool isfil;
  bool sep_1;
  size_t n;
  char separator;
  Path *path;
  char sep;
  char mode;
  string error;
  size_t psize;
  scoped_fixed_array<char_*,_64> ptr;
  scoped_fixed_array<char,_8192> buf;
  undefined7 in_stack_fffffffffffffe38;
  char in_stack_fffffffffffffe3f;
  StringBuffer *in_stack_fffffffffffffe40;
  double in_stack_fffffffffffffe88;
  unsigned_short n_00;
  StringBuffer *in_stack_fffffffffffffe90;
  ulong local_c0;
  long local_b0;
  allocator local_99;
  string local_98 [32];
  size_t local_78;
  scoped_fixed_array<char_*,_64> local_60;
  scoped_fixed_array<char,_8192> local_48;
  StringBuffer *local_30;
  long local_28;
  char *local_20;
  long *local_18;
  byte local_1;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  scoped_fixed_array<char,_8192>::scoped_fixed_array
            ((scoped_fixed_array<char,_8192> *)in_stack_fffffffffffffe40);
  scoped_fixed_array<char_*,_64>::scoped_fixed_array
            ((scoped_fixed_array<char_*,_64> *)in_stack_fffffffffffffe40);
  local_78 = 0;
  for (; this_00 = local_30, *local_20 != '\0'; local_20 = local_20 + 1) {
    if (*local_20 == '%') {
      pcVar8 = local_20 + 1;
      __n = &switchD_00146f1c::switchdataD_001a14b4;
      n_00 = (unsigned_short)((ulong)in_stack_fffffffffffffe88 >> 0x30);
      uVar7 = (uint)((ulong)in_stack_fffffffffffffe88 >> 0x20);
      switch(local_20[1]) {
      case '%':
        local_20 = pcVar8;
        StringBuffer::operator<<(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3f);
        break;
      default:
        cVar1 = *pcVar8;
        local_20 = pcVar8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_98,"unknown meta char: " + cVar1,&local_99);
        std::allocator<char>::~allocator((allocator<char> *)&local_99);
        uVar5 = std::__cxx11::string::c_str();
        (**(code **)(*local_18 + 0x128))(local_18,uVar5);
        local_1 = 0;
        std::__cxx11::string::~string(local_98);
        goto LAB_00147bbb;
      case 'F':
      case 'f':
        if (**(char **)(local_28 + 0x38) == '\0') {
          local_20 = pcVar8;
          (**(code **)(*local_18 + 0x128))(local_18,"no feature information available");
          local_1 = 0;
        }
        else {
          local_20 = pcVar8;
          if (local_78 == 0) {
            in_stack_fffffffffffffe90 =
                 (StringBuffer *)scoped_fixed_array<char,_8192>::get(&local_48);
            pcVar8 = *(char **)(local_28 + 0x38);
            in_stack_fffffffffffffe88 = (double)scoped_fixed_array<char,_8192>::size(&local_48);
            strncpy((char *)in_stack_fffffffffffffe90,pcVar8,(size_t)in_stack_fffffffffffffe88);
            ppcVar6 = (char **)scoped_fixed_array<char,_8192>::get(&local_48);
            max = scoped_fixed_array<char_*,_64>::get(&local_60);
            scoped_fixed_array<char_*,_64>::size(&local_60);
            local_78 = tokenizeCSV<char**>(pcVar8,ppcVar6,(size_t)max);
          }
          pcVar8 = local_20;
          if ((*local_20 == 'F') && (pcVar8 = local_20 + 1, local_20[1] == '\\')) {
            pcVar8 = local_20 + 2;
            local_20 = local_20 + 2;
            getEscapedChar(*pcVar8);
            pcVar8 = local_20;
          }
          local_20 = pcVar8;
          if (local_20[1] == '[') {
            local_c0 = 0;
            bVar3 = false;
            local_20 = local_20 + 2;
            do {
              iVar4 = (int)*local_20;
              if (iVar4 == 0x2c) {
LAB_00147a23:
                if (local_78 <= local_c0) {
                  (**(code **)(*local_18 + 0x128))(local_18,"given index is out of range");
                  local_1 = 0;
                  goto LAB_00147bbb;
                }
                ppcVar6 = scoped_fixed_array<char_*,_64>::operator[](&local_60,local_c0);
                cVar1 = **ppcVar6;
                if (cVar1 != '*') {
                  if (bVar3) {
                    StringBuffer::operator<<(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3f);
                  }
                  in_stack_fffffffffffffe40 = local_30;
                  scoped_fixed_array<char_*,_64>::operator[](&local_60,local_c0);
                  StringBuffer::operator<<
                            (in_stack_fffffffffffffe40,
                             (char *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
                }
                if (*local_20 == ']') goto LAB_00147b8d;
                local_c0 = 0;
                bVar3 = cVar1 != '*';
              }
              else {
                if (9 < iVar4 - 0x30U) {
                  if (iVar4 == 0x5d) goto LAB_00147a23;
                  (**(code **)(*local_18 + 0x128))(local_18,"cannot find \']\'");
                  local_1 = 0;
                  goto LAB_00147bbb;
                }
                local_c0 = local_c0 * 10 + (long)(*local_20 + -0x30);
              }
              local_20 = local_20 + 1;
            } while( true );
          }
          local_20 = local_20 + 1;
          (**(code **)(*local_18 + 0x128))(local_18,"cannot find \'[\'");
          local_1 = 0;
        }
        goto LAB_00147bbb;
      case 'H':
        local_20 = pcVar8;
        StringBuffer::operator<<
                  (in_stack_fffffffffffffe40,
                   (char *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
        break;
      case 'L':
        local_20 = pcVar8;
        (**(code **)(*local_18 + 0x58))();
        StringBuffer::operator<<(in_stack_fffffffffffffe90,(unsigned_long)in_stack_fffffffffffffe88)
        ;
        break;
      case 'M':
        uVar2 = *(ushort *)(local_28 + 0x46);
        local_20 = pcVar8;
        StringBuffer::write(local_30,((int)*(undefined8 *)(local_28 + 0x30) - (uint)uVar2) +
                                     (uint)*(ushort *)(local_28 + 0x44),(void *)(ulong)(uint)uVar2,
                            (ulong)uVar2);
        break;
      case 'P':
        local_20 = pcVar8;
        StringBuffer::operator<<(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        break;
      case 'S':
        local_20 = pcVar8;
        iVar4 = (**(code **)(*local_18 + 0x40))();
        __buf = (void *)(**(code **)(*local_18 + 0x58))();
        StringBuffer::write(this_00,iVar4,__buf,(size_t)__n);
        break;
      case 'c':
        local_20 = pcVar8;
        StringBuffer::operator<<(in_stack_fffffffffffffe90,uVar7);
        break;
      case 'h':
        local_20 = pcVar8;
        StringBuffer::operator<<(in_stack_fffffffffffffe90,n_00);
        break;
      case 'm':
        local_20 = pcVar8;
        StringBuffer::write(local_30,(int)*(undefined8 *)(local_28 + 0x30),
                            (void *)(ulong)*(ushort *)(local_28 + 0x44),0x1a14b4);
        break;
      case 'p':
        pcVar8 = local_20 + 2;
        switch(local_20[2]) {
        case 'A':
          local_20 = pcVar8;
          StringBuffer::operator<<(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
          break;
        case 'B':
          local_20 = pcVar8;
          StringBuffer::operator<<(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
          break;
        case 'C':
          local_20 = pcVar8;
          StringBuffer::operator<<(in_stack_fffffffffffffe90,(long)in_stack_fffffffffffffe88);
          break;
        default:
          local_20 = pcVar8;
          (**(code **)(*local_18 + 0x128))(local_18,"[iseSCwcnblLh] is required after %p");
          local_1 = 0;
          goto LAB_00147bbb;
        case 'L':
          local_20 = pcVar8;
          StringBuffer::operator<<(in_stack_fffffffffffffe90,n_00);
          break;
        case 'P':
          local_20 = pcVar8;
          StringBuffer::operator<<(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
          break;
        case 'S':
          uVar7 = (uint)*(ushort *)(local_28 + 0x44);
          local_20 = pcVar8;
          StringBuffer::write(local_30,((int)*(undefined8 *)(local_28 + 0x30) -
                                       (uint)*(ushort *)(local_28 + 0x46)) + uVar7,
                              (void *)(long)(int)(*(ushort *)(local_28 + 0x46) - uVar7),(ulong)uVar7
                             );
          break;
        case 'b':
          local_20 = pcVar8;
          StringBuffer::operator<<(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3f);
          break;
        case 'c':
          local_20 = pcVar8;
          StringBuffer::operator<<(in_stack_fffffffffffffe90,(long)in_stack_fffffffffffffe88);
          break;
        case 'e':
          local_20 = pcVar8;
          (**(code **)(*local_18 + 0x40))();
          StringBuffer::operator<<
                    (in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
          break;
        case 'h':
          pcVar8 = local_20 + 3;
          if (local_20[3] == 'l') {
            local_20 = pcVar8;
            StringBuffer::operator<<(in_stack_fffffffffffffe90,n_00);
          }
          else {
            if (local_20[3] != 'r') {
              local_20 = pcVar8;
              (**(code **)(*local_18 + 0x128))(local_18,"lr is required after %ph");
              local_1 = 0;
              goto LAB_00147bbb;
            }
            local_20 = pcVar8;
            StringBuffer::operator<<(in_stack_fffffffffffffe90,n_00);
          }
          break;
        case 'i':
          local_20 = pcVar8;
          StringBuffer::operator<<(in_stack_fffffffffffffe90,uVar7);
          break;
        case 'l':
          local_20 = pcVar8;
          StringBuffer::operator<<(in_stack_fffffffffffffe90,n_00);
          break;
        case 'n':
          local_20 = pcVar8;
          StringBuffer::operator<<(in_stack_fffffffffffffe90,(long)in_stack_fffffffffffffe88);
          break;
        case 'p':
          cVar1 = local_20[3];
          pcVar8 = local_20 + 4;
          if (local_20[4] == '\\') {
            pcVar8 = local_20 + 5;
            local_20 = local_20 + 5;
            getEscapedChar(*pcVar8);
            pcVar8 = local_20;
          }
          local_20 = pcVar8;
          if (*(long *)(local_28 + 0x28) == 0) {
            (**(code **)(*local_18 + 0x128))(local_18,"no path information is available");
            local_1 = 0;
            goto LAB_00147bbb;
          }
          for (local_b0 = *(long *)(local_28 + 0x28); local_b0 != 0;
              local_b0 = *(long *)(local_b0 + 0x18)) {
            if (local_b0 != *(long *)(local_28 + 0x28)) {
              StringBuffer::operator<<(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3f);
            }
            if (cVar1 == 'P') {
              StringBuffer::operator<<(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
            }
            else {
              uVar7 = (uint)((ulong)in_stack_fffffffffffffe88 >> 0x20);
              if (cVar1 == 'c') {
                StringBuffer::operator<<(in_stack_fffffffffffffe90,uVar7);
              }
              else {
                if (cVar1 != 'i') {
                  (**(code **)(*local_18 + 0x128))(local_18,"[icP] is required after %pp");
                  local_1 = 0;
                  goto LAB_00147bbb;
                }
                StringBuffer::operator<<(in_stack_fffffffffffffe90,uVar7);
              }
            }
          }
          break;
        case 's':
          local_20 = pcVar8;
          (**(code **)(*local_18 + 0x40))();
          StringBuffer::operator<<
                    (in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
          break;
        case 'w':
          local_20 = pcVar8;
          StringBuffer::operator<<(in_stack_fffffffffffffe90,n_00);
        }
        break;
      case 's':
        local_20 = pcVar8;
        StringBuffer::operator<<(in_stack_fffffffffffffe90,uVar7);
        break;
      case 't':
        local_20 = pcVar8;
        StringBuffer::operator<<(in_stack_fffffffffffffe90,uVar7);
      }
    }
    else if (*local_20 == '\\') {
      pcVar8 = local_20 + 1;
      local_20 = local_20 + 1;
      getEscapedChar(*pcVar8);
      StringBuffer::operator<<(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3f);
    }
    else {
      StringBuffer::operator<<(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3f);
    }
LAB_00147b8d:
  }
  local_1 = 1;
LAB_00147bbb:
  scoped_fixed_array<char_*,_64>::~scoped_fixed_array
            ((scoped_fixed_array<char_*,_64> *)in_stack_fffffffffffffe40);
  scoped_fixed_array<char,_8192>::~scoped_fixed_array
            ((scoped_fixed_array<char,_8192> *)in_stack_fffffffffffffe40);
  return (bool)(local_1 & 1);
}

Assistant:

bool Writer::writeNode(Lattice *lattice,
                       const char *p,
                       const Node *node,
                       StringBuffer *os) const {
  scoped_fixed_array<char, BUF_SIZE> buf;
  scoped_fixed_array<char *, 64> ptr;
  size_t psize = 0;

  for (; *p; p++) {
    switch (*p) {
      default: *os << *p; break;

      case '\\': *os << getEscapedChar(*++p); break;

      case '%': {  // macros
        switch (*++p) {
          default: {
            const std::string error = "unknown meta char: " + *p;
            lattice->set_what(error.c_str());
            return false;
          }
            // input sentence
          case 'S': os->write(lattice->sentence(), lattice->size()); break;
            // sentence length
          case 'L': *os << lattice->size(); break;
            // morph
          case 'm': os->write(node->surface, node->length); break;
          case 'M': os->write(reinterpret_cast<const char *>
                              (node->surface - node->rlength + node->length),
                              node->rlength);
            break;
          case 'h': *os << node->posid; break;  // Part-Of-Speech ID
          case '%': *os << '%'; break;         // %
          case 'c': *os << static_cast<int>(node->wcost); break;  // word cost
          case 'H': *os << node->feature; break;
          case 't': *os << static_cast<unsigned int>(node->char_type); break;
          case 's': *os << static_cast<unsigned int>(node->stat); break;
          case 'P': *os << node->prob; break;
          case 'p': {
            switch (*++p) {
              default:
                lattice->set_what("[iseSCwcnblLh] is required after %p");
                return false;
              case 'i': *os << node->id; break;  // node id
              case 'S': os->write(reinterpret_cast<const char*>
                                  (node->surface -
                                   node->rlength + node->length),
                                  node->rlength - node->length);
                break;  // space
                // start position
              case 's': *os << static_cast<int>(
                  node->surface - lattice->sentence());
                break;
                // end position
              case 'e': *os << static_cast<int>
                    (node->surface - lattice->sentence() + node->length);
                break;
                // connection cost
              case 'C': *os << node->cost -
                    node->prev->cost - node->wcost;
                break;
              case 'w': *os << node->wcost; break;  // word cost
              case 'c': *os << node->cost; break;  // best cost
              case 'n': *os << (node->cost - node->prev->cost); break;
                // node cost
                // * if best path, otherwise ' '
              case 'b': *os << (node->isbest ? '*' : ' '); break;
              case 'P': *os << node->prob; break;
              case 'A': *os << node->alpha; break;
              case 'B': *os << node->beta; break;
              case 'l': *os << node->length; break;  // length of morph
                // length of morph including the spaces
              case 'L': *os << node->rlength;    break;
              case 'h': {  // Hidden Layer ID
                switch (*++p) {
                  default:
                    lattice->set_what("lr is required after %ph");
                    return false;
                  case 'l': *os << node->lcAttr; break;   // current
                  case 'r': *os << node->rcAttr; break;   // prev
                }
              } break;

              case 'p': {
                char mode = *++p;
                char sep = *++p;
                if (sep == '\\') {
                  sep = getEscapedChar(*++p);
                }
                if (!node->lpath) {
                  lattice->set_what("no path information is available");
                  return false;
                }
                for (Path *path = node->lpath; path; path = path->lnext) {
                  if (path != node->lpath) *os << sep;
                  switch (mode) {
                    case 'i': *os << path->lnode->id; break;
                    case 'c': *os << path->cost; break;
                    case 'P': *os << path->prob; break;
                    default:
                      lattice->set_what("[icP] is required after %pp");
                      return false;
                  }
                }
              } break;

            }
          } break;

          case 'F':
          case 'f': {
            if (node->feature[0] == '\0') {
              lattice->set_what("no feature information available");
              return false;
            }
            if (!psize) {
              std::strncpy(buf.get(), node->feature, buf.size());
              psize = tokenizeCSV(buf.get(), ptr.get(), ptr.size());
            }

            // separator
            char separator = '\t';  // default separator
            if (*p == 'F') {  // change separator
              if (*++p == '\\') {
                separator = getEscapedChar(*++p);
              } else {
                separator = *p;
              }
            }

            if (*++p !='[') {
              lattice->set_what("cannot find '['");
              return false;
            }
            size_t n = 0;
            bool sep = false;
            bool isfil = false;
            p++;

            for (;; ++p) {
              switch (*p) {
                case '0': case '1': case '2': case '3': case '4':
                case '5': case '6': case '7': case '8': case '9':
                  n = 10 * n +(*p - '0');
                  break;
                case ',': case ']':
                  if (n >= psize) {
                    lattice->set_what("given index is out of range");
                    return false;
                  }
                  isfil = (ptr[n][0] != '*');
                  if (isfil) {
                    if (sep) {
                      *os << separator;
                    }
                    *os << ptr[n];
                  }
                  if (*p == ']') {
                    goto last;
                  }
                  sep = isfil;
                  n = 0;
                  break;
                default:
                  lattice->set_what("cannot find ']'");
                  return false;
              }
            }
          } last: break;
        }  // end switch
      } break;  // end case '%'
    }  // end switch
  }

  return true;
}